

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listing.cpp
# Opt level: O2

void listing_load_inputfile(char *src_filename)

{
  string line;
  ifstream src;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&src,src_filename,_S_in);
  while ((abStack_208[*(long *)(_src + -0x18)] & 2) == 0) {
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&src,(string *)&line);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&srcfile_abi_cxx11_,&line);
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&src);
  return;
}

Assistant:

void listing_load_inputfile(const char *src_filename)
{
	try {
		std::ifstream src (src_filename);
		while ( ! src.eof()) {
			std::string line;
			getline(src, line);
			srcfile.push_back(line);
		}
		src.close();
	} catch (std::ios_base::failure& e) {
		std::cerr << "IO exception: " << e.what() << endl;
	}
}